

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void sel_move_grow_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,Am_Value *new_sel,
               Am_Value *new_value)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Value local_f8;
  Am_Value local_e8;
  Am_Value local_d8;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object ref_obj;
  int top;
  int left;
  Am_Value local_a0;
  Am_Value local_90;
  Am_Value local_80;
  byte local_69;
  undefined1 local_68 [7];
  bool growing;
  Am_Value new_data_value;
  Am_Value old_data_value;
  Am_Object parent;
  Am_Object local_30;
  Am_Object inter;
  Am_Value *new_value_local;
  Am_Value *new_sel_local;
  bool reload_data_local;
  bool selective_local;
  bool undo_local;
  Am_Object *command_obj_local;
  
  inter.data = (Am_Object_Data *)new_value;
  Am_Object::Am_Object(&local_30);
  pAVar2 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&local_30,pAVar2);
  if ((reload_data) && (bVar1 = Am_Value::Valid(new_sel), bVar1)) {
    Am_Object::Set(command_obj,0x16d,new_sel,0);
    Am_Object::Am_Object((Am_Object *)&old_data_value.value);
    pAVar2 = Am_Object::Get(command_obj,0x154,0);
    Am_Object::operator=((Am_Object *)&old_data_value.value,pAVar2);
    bVar1 = Am_Object::Valid((Am_Object *)&old_data_value.value);
    if (bVar1) {
      Am_Object::Set((Am_Object *)&old_data_value.value,0x16d,new_sel,0);
    }
    Am_Object::~Am_Object((Am_Object *)&old_data_value.value);
  }
  else {
    pAVar2 = Am_Object::Peek(command_obj,0x16d,0);
    Am_Value::operator=(new_sel,pAVar2);
  }
  bVar1 = Am_Value::Valid(new_sel);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)&new_data_value.value);
    Am_Value::Am_Value((Am_Value *)local_68);
    pAVar2 = Am_Object::Peek(command_obj,0x16c,0);
    Am_Value::operator=((Am_Value *)&new_data_value.value,pAVar2);
    if (!reload_data) {
      pAVar2 = Am_Object::Peek(command_obj,0x169,0);
      Am_Value::operator=((Am_Value *)local_68,pAVar2);
    }
    pAVar2 = Am_Object::Get(command_obj,0xda,0);
    local_69 = Am_Value::operator_cast_to_bool(pAVar2);
    if (selective) {
      if (undo) {
        Am_Value::Am_Value(&local_80,new_sel);
        update_data_from_objs(&local_80,(Am_Value *)local_68);
        Am_Value::~Am_Value(&local_80);
      }
      else {
        Am_Value::Am_Value(&local_90,new_sel);
        update_data_from_objs(&local_90,(Am_Value *)&new_data_value.value);
        Am_Value::~Am_Value(&local_90);
      }
    }
    if (undo) {
      Am_Value::Am_Value(&local_a0,new_sel);
      Am_Value::Am_Value((Am_Value *)&top,(Am_Value *)&new_data_value.value);
      update_objs_from_value(&local_a0,(Am_Value *)&top,(bool)(local_69 & 1),command_obj);
      Am_Value::~Am_Value((Am_Value *)&top);
      Am_Value::~Am_Value(&local_a0);
      Am_Object::Set(command_obj,0x16c,(Am_Value *)local_68,0);
      Am_Object::Set(command_obj,0x169,(Am_Value *)&new_data_value.value,0);
    }
    else {
      if (reload_data) {
        bVar1 = Am_Value::Valid(new_value);
        if (bVar1) {
          Am_Value::operator=((Am_Value *)local_68,new_value);
          pAVar2 = Am_Object::Get(command_obj,0x171,0);
          Am_Object::Am_Object(&local_c0,pAVar2);
          Am_Object::Am_Object(&local_c8,&local_c0);
          get_left_and_top_from_new_value
                    (new_value,&local_c8,(int *)((long)&ref_obj.data + 4),(int *)&ref_obj);
          Am_Object::~Am_Object(&local_c8);
          Am_Object::~Am_Object(&local_c0);
        }
        else {
          pAVar2 = Am_Object::Get(command_obj,100,0);
          ref_obj.data._4_4_ = Am_Value::operator_cast_to_int(pAVar2);
          pAVar2 = Am_Object::Get(command_obj,0x65,0);
          ref_obj.data._0_4_ = Am_Value::operator_cast_to_int(pAVar2);
        }
        Am_Value::Am_Value(&local_d8,new_sel);
        update_new_objs_from_pos
                  (&local_d8,ref_obj.data._4_4_,(int)ref_obj.data,(Am_Value *)local_68,
                   (bool)(local_69 & 1),command_obj);
        Am_Value::~Am_Value(&local_d8);
        Am_Object::Set(command_obj,100,ref_obj.data._4_4_,0);
        Am_Object::Set(command_obj,0x65,(int)ref_obj.data,0);
      }
      else {
        Am_Value::Am_Value(&local_e8,new_sel);
        Am_Value::Am_Value(&local_f8,(Am_Value *)local_68);
        update_objs_from_value(&local_e8,&local_f8,(bool)(local_69 & 1),command_obj);
        Am_Value::~Am_Value(&local_f8);
        Am_Value::~Am_Value(&local_e8);
      }
      if (selective) {
        Am_Object::Set(command_obj,0x16c,(Am_Value *)&new_data_value.value,0);
      }
      if (reload_data) {
        Am_Object::Set(command_obj,0x169,(Am_Value *)local_68,0);
      }
    }
    Am_Value::~Am_Value((Am_Value *)local_68);
    Am_Value::~Am_Value((Am_Value *)&new_data_value.value);
  }
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

void
sel_move_grow_general_undo_redo(Am_Object command_obj, bool undo,
                                bool selective, bool reload_data,
                                Am_Value new_sel = Am_No_Value,
                                Am_Value new_value = Am_No_Value)
{
  Am_Object inter;
  inter = command_obj.Get(Am_SAVED_OLD_OWNER);

  if (reload_data && new_sel.Valid()) {
    command_obj.Set(Am_OBJECT_MODIFIED, new_sel);
    Am_Object parent;
    parent = command_obj.Get(Am_IMPLEMENTATION_PARENT);
    if (parent.Valid())
      parent.Set(Am_OBJECT_MODIFIED, new_sel);
  } else
    new_sel = command_obj.Peek(Am_OBJECT_MODIFIED);

#ifdef DEBUG
  if (inter.Valid() && Am_Inter_Tracing(inter)) {
    if (selective)
      std::cout << "Selective ";
    if (undo)
      std::cout << "Undo";
    else
      std::cout << "repeat";
    std::cout << " command " << command_obj << " on " << new_sel << std::endl
              << std::flush;
  }
#endif
  if (new_sel.Valid()) {
    Am_Value old_data_value, new_data_value;

    old_data_value = command_obj.Peek(Am_OLD_VALUE);
    if (!reload_data)
      new_data_value = command_obj.Peek(Am_VALUE);
    bool growing = command_obj.Get(Am_GROWING);
    if (selective) {
      if (undo)
        update_data_from_objs(new_sel, new_data_value);
      else
        update_data_from_objs(new_sel, old_data_value);
    }
    if (undo) {
      update_objs_from_value(new_sel, old_data_value, growing, command_obj);
      // swap current and old values, in case undo or undo-the-undo again
      command_obj.Set(Am_OLD_VALUE, new_data_value);
      command_obj.Set(Am_VALUE, old_data_value);
    } else {
      if (reload_data) {
        int left, top;
        if (new_value.Valid()) {
          new_data_value = new_value;
          Am_Object ref_obj = command_obj.Get(Am_SAVED_OLD_OBJECT_OWNER);
          get_left_and_top_from_new_value(new_value, ref_obj, left, top);
        } else {
          left = command_obj.Get(Am_LEFT);
          top = command_obj.Get(Am_TOP);
        }
        update_new_objs_from_pos(new_sel, left, top, new_data_value, growing,
                                 command_obj);
        command_obj.Set(Am_LEFT, left);
        command_obj.Set(Am_TOP, top);
      } else
        update_objs_from_value(new_sel, new_data_value, growing, command_obj);
      if (selective)
        command_obj.Set(Am_OLD_VALUE, old_data_value);
      if (reload_data)
        command_obj.Set(Am_VALUE, new_data_value);
    }
  }
}